

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::precise::equations::convert_value_to_equnit(double val,unit_data *UT)

{
  bool bVar1;
  int iVar2;
  unit_data *in_RDI;
  double in_XMM0_Qa;
  __type_conflict1 _Var3;
  double dVar4;
  double out_1;
  double out;
  int logtype;
  unit_data *in_stack_ffffffffffffff70;
  double local_70;
  double local_58;
  double local_40;
  double local_8;
  
  bVar1 = units::detail::unit_data::is_equation(in_RDI);
  local_8 = in_XMM0_Qa;
  if (bVar1) {
    iVar2 = custom::eq_type(in_stack_ffffffffffffff70);
    if ((0xf < iVar2) || (0.0 < in_XMM0_Qa)) {
      switch(iVar2) {
      case 0:
      case 10:
        local_8 = log10(in_XMM0_Qa);
        break;
      case 1:
        bVar1 = is_power_unit(in_stack_ffffffffffffff70);
        local_40 = 0.5;
        if (!bVar1) {
          local_40 = 1.0;
        }
        local_8 = ::log(in_XMM0_Qa);
        local_8 = local_40 * local_8;
        break;
      case 2:
        bVar1 = is_power_unit(in_stack_ffffffffffffff70);
        local_58 = 1.0;
        if (!bVar1) {
          local_58 = 2.0;
        }
        local_8 = log10(in_XMM0_Qa);
        local_8 = local_58 * local_8;
        break;
      case 3:
        bVar1 = is_power_unit(in_stack_ffffffffffffff70);
        local_70 = 10.0;
        if (!bVar1) {
          local_70 = 20.0;
        }
        local_8 = log10(in_XMM0_Qa);
        local_8 = local_70 * local_8;
        break;
      case 4:
        local_8 = log10(in_XMM0_Qa);
        local_8 = -local_8;
        break;
      case 5:
        dVar4 = log10(in_XMM0_Qa);
        local_8 = -dVar4 / 2.0;
        break;
      case 6:
        dVar4 = log10(in_XMM0_Qa);
        local_8 = -dVar4 / 3.0;
        break;
      case 7:
        dVar4 = log10(in_XMM0_Qa);
        _Var3 = std::log10<int>(0);
        local_8 = -dVar4 / _Var3;
        break;
      case 8:
        local_8 = log2(in_XMM0_Qa);
        break;
      case 9:
        local_8 = ::log(in_XMM0_Qa);
        break;
      case 0xb:
        local_8 = log10(in_XMM0_Qa);
        local_8 = local_8 * 10.0;
        break;
      case 0xc:
        local_8 = log10(in_XMM0_Qa);
        local_8 = local_8 * 2.0;
        break;
      case 0xd:
        local_8 = log10(in_XMM0_Qa);
        local_8 = local_8 * 20.0;
        break;
      case 0xe:
        local_8 = log10(in_XMM0_Qa);
        _Var3 = std::log10<int>(0);
        local_8 = local_8 / _Var3;
        break;
      case 0xf:
        local_8 = ::log(in_XMM0_Qa);
        local_8 = local_8 * 0.5;
        break;
      case 0x10:
        local_8 = 141.5 / in_XMM0_Qa - 131.5;
        break;
      case 0x11:
        local_8 = 140.0 / in_XMM0_Qa - 130.0;
        break;
      case 0x12:
        local_8 = (1.0 - 1.0 / in_XMM0_Qa) * 145.0;
        break;
      default:
        break;
      case 0x16:
        dVar4 = fma(1.75748569529e-10,in_XMM0_Qa,-9.09204303833e-08);
        dVar4 = fma(dVar4,in_XMM0_Qa,1.5227445578e-05);
        dVar4 = fma(dVar4,in_XMM0_Qa,-0.000773787973277);
        dVar4 = fma(dVar4,in_XMM0_Qa,0.0281978682167);
        local_8 = fma(dVar4,in_XMM0_Qa,-0.667563481438);
        break;
      case 0x17:
        dVar4 = fma(2.18882896425e-08,in_XMM0_Qa,-4.78236313769e-06);
        dVar4 = fma(dVar4,in_XMM0_Qa,0.000391121840061);
        dVar4 = fma(dVar4,in_XMM0_Qa,-0.0152427367162);
        dVar4 = fma(dVar4,in_XMM0_Qa,0.424089585061);
        local_8 = fma(dVar4,in_XMM0_Qa,0.49924168937);
        break;
      case 0x18:
        local_8 = pow(in_XMM0_Qa / 14.1,0.6666666666666666);
        local_8 = local_8 - 2.0;
        break;
      case 0x1b:
        local_8 = tan(in_XMM0_Qa);
        local_8 = local_8 * 100.0;
        break;
      case 0x1d:
        dVar4 = log10(in_XMM0_Qa);
        local_8 = dVar4 * 0.6666666666666666 + -10.7;
        break;
      case 0x1e:
        dVar4 = log10(in_XMM0_Qa);
        local_8 = dVar4 * 0.6666666666666666 + -3.2;
      }
    }
    else {
      local_8 = NAN;
    }
  }
  return local_8;
}

Assistant:

inline double
            convert_value_to_equnit(double val, const detail::unit_data& UT)
        {
            if (!UT.is_equation()) {
                return val;
            }
            int logtype = custom::eq_type(UT);
            if ((logtype < 16) && (val <= 0.0)) {
                return constants::invalid_conversion;
            }

            switch (logtype) {
                case 0:
                case 10:
                    return std::log10(val);
                case 1:
                    return ((is_power_unit(UT)) ? 0.5 : 1.0) * (std::log)(val);
                case 2:
                    return ((is_power_unit(UT)) ? 1.0 : 2.0) * std::log10(val);
                case 3:
                    return ((is_power_unit(UT)) ? 10.0 : 20.0) *
                        std::log10(val);
                case 4:
                    return -std::log10(val);
                case 5:
                    return -std::log10(val) / 2.0;
                case 6:
                    return -std::log10(val) / 3.0;
                case 7:
                    return -std::log10(val) / std::log10(50000);
                case 8:
                    return (std::log2)(val);
                case 9:
                    return (std::log)(val);
                case 11:
                    return 10.0 * std::log10(val);
                case 12:
                    return 2.0 * std::log10(val);
                case 13:
                    return 20.0 * std::log10(val);
                case 14:
                    return std::log10(val) / std::log10(3);
                case 15:
                    return 0.5 * (std::log)(val);
                case 16:  // API Gravity
                    return 141.5 / (val)-131.5;
                case 17:  // degree Baume Light
                    return 140.0 / val - 130;
                case 18:  // degree Baume Heavy
                    return 145.0 * (1.0 - 1.0 / val);
                case 22:  // saffir simpson hurricane scale from wind speed
                {  // using horners method on polynomial approximation of
                   // saffir-simpson wind speed scale
                    double out = 1.75748569529e-10;
                    out = std::fma(out, val, -9.09204303833e-08);
                    out = std::fma(out, val, 1.52274455780e-05);
                    out = std::fma(out, val, -7.73787973277e-04);
                    out = std::fma(out, val, 2.81978682167e-02);
                    out = std::fma(out, val, -6.67563481438e-01);
                    return out;
                }
                case 23: {  // Beaufort wind scale
                    double out = 2.18882896425e-08;
                    out = std::fma(out, val, -4.78236313769e-06);
                    out = std::fma(out, val, 3.91121840061e-04);
                    out = std::fma(out, val, -1.52427367162e-02);
                    out = std::fma(out, val, 4.24089585061e-01);
                    out = std::fma(out, val, 4.99241689370e-01);
                    return out;
                }
                case 24:  // fujita scale
                    return std::pow(val / 14.1, 2.0 / 3.0) - 2.0;
                case 27:  // prism diopter
                    return 100.0 * std::tan(val);
                case 29:  // moment magnitude scale
                    return 2.0 / 3.0 * std::log10(val) - 10.7;
                case 30:  // energy magnitude scale
                    return 2.0 / 3.0 * std::log10(val) - 3.2;
                default:
                    return val;
            }
        }